

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

bool __thiscall
icu_63::RBBITableBuilder::findDuplCharClassFrom(RBBITableBuilder *this,IntPair *categories)

{
  long lVar1;
  int32_t iVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 uVar8;
  int32_t state;
  int iVar9;
  undefined4 uVar10;
  ushort uVar11;
  int iVar12;
  
  iVar9 = this->fDStates->count;
  iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  iVar12 = 0;
  if (0 < iVar9) {
    iVar12 = iVar9;
  }
  uVar3 = categories->first;
  while ((int)uVar3 < iVar2 + -1) {
    uVar5 = (ulong)uVar3;
    uVar7 = uVar5;
    while( true ) {
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      categories->second = uVar6;
      if (iVar2 <= (int)uVar6) break;
      uVar10 = 0;
      uVar8 = 1;
      iVar9 = 0;
      do {
        if (iVar12 == iVar9) {
          uVar11 = (ushort)uVar8 ^ (ushort)uVar10;
          break;
        }
        pvVar4 = UVector::elementAt(this->fDStates,iVar9);
        lVar1 = *(long *)((long)pvVar4 + 0x28);
        uVar5 = (ulong)categories->first;
        uVar8 = 0;
        uVar10 = 0;
        if ((-1 < (long)uVar5) && (categories->first < *(int *)(lVar1 + 8))) {
          uVar10 = *(undefined4 *)(*(long *)(lVar1 + 0x18) + uVar5 * 4);
        }
        uVar7 = (ulong)categories->second;
        if ((-1 < (long)uVar7) && (categories->second < *(int *)(lVar1 + 8))) {
          uVar8 = *(undefined4 *)(*(long *)(lVar1 + 0x18) + uVar7 * 4);
        }
        uVar11 = (ushort)uVar8 ^ (ushort)uVar10;
        iVar9 = iVar9 + 1;
      } while (uVar11 == 0);
      if (uVar11 == 0) goto LAB_00309477;
    }
    uVar3 = (int)uVar5 + 1;
    categories->first = uVar3;
  }
LAB_00309477:
  return (int)uVar3 < iVar2 + -1;
}

Assistant:

bool RBBITableBuilder::findDuplCharClassFrom(IntPair *categories) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; categories->first < numCols-1; categories->first++) {
        for (categories->second=categories->first+1; categories->second < numCols; categories->second++) {
            // Initialized to different values to prevent returning true if numStates = 0 (implies no duplicates).
            uint16_t table_base = 0;
            uint16_t table_dupl = 1;
            for (int32_t state=0; state<numStates; state++) {
                RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
                table_base = (uint16_t)sd->fDtran->elementAti(categories->first);
                table_dupl = (uint16_t)sd->fDtran->elementAti(categories->second);
                if (table_base != table_dupl) {
                    break;
                }
            }
            if (table_base == table_dupl) {
                return true;
            }
        }
    }
    return false;
}